

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void bitmanip::anon_unknown_0::runTest(Test *test)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long in_FS_OFFSET;
  allocator<char> local_a1;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  char *local_80;
  char *pcStack_78;
  undefined8 local_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  long local_28;
  long *local_20;
  
  __s2 = test->category;
  iVar2 = strcmp(*(char **)(in_FS_OFFSET + -8),__s2);
  if (iVar2 != 0) {
    *(char **)(in_FS_OFFSET + -8) = __s2;
    if (detail::logLevel < 4) goto LAB_0010450c;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s2,&local_a1);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x1150e9);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar4;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_90 = *plVar4;
      lStack_88 = plVar3[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar4;
      local_a0 = (long *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/main.cpp";
    pcStack_78 = "runTest";
    local_70 = 0x14;
    local_20 = local_a0;
    local_28 = local_98;
    (*(code *)detail::logFormatter)(4,&local_28,1);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  if (4 < detail::logLevel) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,test->name,&local_a1);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x1150fd);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar4;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_90 = *plVar4;
      lStack_88 = plVar3[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar4;
      local_a0 = (long *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/main.cpp";
    pcStack_78 = "runTest";
    local_70 = 0x16;
    local_28 = local_98;
    local_20 = local_a0;
    (*(code *)detail::logFormatter)(5,&local_28,1);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
LAB_0010450c:
  bVar1 = Test::operator()(test);
  (anonymous_namespace)::testFailureCount = (anonymous_namespace)::testFailureCount + (uint)!bVar1;
  return;
}

Assistant:

void runTest(const Test &test) noexcept
{
    static thread_local const char *previousCategory = "";

    if (std::strcmp(previousCategory, test.category) != 0) {
        previousCategory = test.category;
        BITMANIP_LOG(IMPORTANT, "Category: \"" + std::string{test.category} + "\" tests");
    }
    BITMANIP_LOG(INFO, "Running \"" + std::string{test.name} + "\" ...");
    testFailureCount += not test.operator()();
}